

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * Json::valueToString_abi_cxx11_(LargestInt value)

{
  char *pcVar1;
  LargestUInt in_RSI;
  string *in_RDI;
  bool isNegative;
  char *current;
  UIntToStringBuffer buffer;
  allocator local_42;
  byte local_41;
  char *local_40 [4];
  char acStack_1f [15];
  LargestUInt local_10;
  
  local_40[0] = acStack_1f;
  local_41 = (long)in_RSI < 0;
  local_10 = in_RSI;
  if ((bool)local_41) {
    local_10 = -in_RSI;
  }
  uintToString(local_10,local_40);
  if ((local_41 & 1) != 0) {
    pcVar1 = local_40[0] + -1;
    local_40[0] = local_40[0] + -1;
    *pcVar1 = '-';
  }
  pcVar1 = local_40[0];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_42);
  std::allocator<char>::~allocator((allocator<char> *)&local_42);
  return in_RDI;
}

Assistant:

std::string valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  bool isNegative = value < 0;
  if (isNegative)
    value = -value;
  uintToString(LargestUInt(value), current);
  if (isNegative)
    *--current = '-';
  assert(current >= buffer);
  return current;
}